

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_model_component.cpp
# Opt level: O0

bool ON_ModelComponent::UniqueNameRequired(Type component_type)

{
  bool local_9;
  Type component_type_local;
  
  if ((byte)(component_type - Image) < 3) {
LAB_007674be:
    local_9 = false;
  }
  else {
    if (4 < (byte)(component_type - LinePattern)) {
      if (component_type == RenderLight) goto LAB_007674be;
      if (1 < (byte)(component_type - HatchPattern)) {
        if ((byte)(component_type - ModelGeometry) < 3) goto LAB_007674be;
        if ((component_type != EmbeddedFile) && (component_type != SectionStyle)) {
          ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_model_component.cpp"
                     ,0x807,"","Invalid component_type parameter.");
          return false;
        }
      }
    }
    local_9 = true;
  }
  return local_9;
}

Assistant:

bool ON_ModelComponent::UniqueNameRequired(ON_ModelComponent::Type component_type)
{
  // [Giulio] If this table is changed, then also 
  // Rhino.DocObjects.ModelComponent.ModelComponentTypeRequiresUniqueName()
  // will need the same tweak.

  switch (component_type)
  {
  case ON_ModelComponent::Type::LinePattern:
  case ON_ModelComponent::Type::Layer:
  case ON_ModelComponent::Type::Group:
  case ON_ModelComponent::Type::TextStyle:
  case ON_ModelComponent::Type::DimStyle:
  case ON_ModelComponent::Type::HatchPattern:
  case ON_ModelComponent::Type::InstanceDefinition:
  case ON_ModelComponent::Type::EmbeddedFile:
  case ON_ModelComponent::Type::SectionStyle:
    return true;

  case ON_ModelComponent::Type::Image:
  case ON_ModelComponent::Type::TextureMapping:
  case ON_ModelComponent::Type::Material:
  case ON_ModelComponent::Type::RenderContent: // JohnC: TODO: Giulio's tweak above. Left for the wrapping phase.
  case ON_ModelComponent::Type::RenderLight:
  case ON_ModelComponent::Type::ModelGeometry:
  case ON_ModelComponent::Type::HistoryRecord:
    return false;

  default:
    ON_ERROR("Invalid component_type parameter.");
    return false;
  }
}